

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_2_5::maxEigenVector<Imath_2_5::Matrix44<double>,Imath_2_5::Vec4<double>>
               (Matrix44<double> *A,Vec4<double> *V)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  Vec4<double> *in_RSI;
  Vec4<double> *pVVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  uint i_1;
  uint i;
  int maxIdx;
  Matrix44<double> MV;
  Vec4<double> S;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff48;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff4c;
  uint i_00;
  Matrix44<double> *in_stack_ffffffffffffff50;
  Vec4<double> local_30;
  Vec4<double> *local_10;
  
  local_10 = in_RSI;
  Vec4<double>::Vec4(&local_30);
  Matrix44<double>::Matrix44
            ((Matrix44<double> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  jacobiEigenSolver<double>
            (in_stack_ffffffffffffff50,
             (Vec4<double> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (Matrix44<double> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  i_00 = 0;
  uVar6 = 1;
  while( true ) {
    uVar5 = uVar6;
    uVar2 = Vec4<double>::dimensions();
    if (uVar2 <= uVar6) break;
    pVVar4 = &local_30;
    Vec4<double>::operator[](pVVar4,uVar5);
    std::abs((int)pVVar4);
    pVVar4 = &local_30;
    Vec4<double>::operator[](pVVar4,i_00);
    std::abs((int)pVVar4);
    if (extraout_XMM0_Qa_00 < extraout_XMM0_Qa) {
      i_00 = uVar5;
    }
    uVar6 = uVar5 + 1;
  }
  uVar6 = 0;
  while( true ) {
    uVar5 = uVar6;
    uVar2 = Vec4<double>::dimensions();
    if (uVar2 <= uVar6) break;
    pdVar3 = Matrix44<double>::operator[]((Matrix44<double> *)&stack0xffffffffffffff50,uVar5);
    dVar1 = pdVar3[(int)i_00];
    pdVar3 = Vec4<double>::operator[](local_10,uVar5);
    *pdVar3 = dVar1;
    uVar6 = uVar5 + 1;
  }
  return;
}

Assistant:

void
maxEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver(A, S, MV);

    int maxIdx(0);
    for(unsigned int i = 1; i < TV::dimensions(); ++i)
    {
        if(std::abs(S[i]) > std::abs(S[maxIdx]))
            maxIdx = i;
    }

    for(unsigned int i = 0; i < TV::dimensions(); ++i)
        V[i] = MV[i][maxIdx];
}